

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O2

ProgramData * __thiscall
deqp::gles2::Performance::anon_unknown_1::DeadCodeEliminationCase::generateProgramData
          (ProgramData *__return_storage_ptr__,DeadCodeEliminationCase *this,bool optimized)

{
  CaseShaderType CVar1;
  int numRepeats;
  int iVar2;
  int iVar3;
  bool useConst;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  allocator<char> local_192;
  allocator<char> local_191;
  int numLoopIterations;
  string precision;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string statements;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  int numLoopIterations_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string funcDefs;
  string local_70;
  string local_50;
  
  pbVar4 = &bStack_1d8;
  CVar1 = (this->super_ShaderOptimizationCase).m_caseShaderType;
  Performance::(anonymous_namespace)::getShaderPrecision_abi_cxx11_
            (&precision,(_anonymous_namespace_ *)(ulong)CVar1,
             (CaseShaderType)CONCAT71(in_register_00000011,optimized));
  numRepeats = 1;
  if (this->m_caseType == CASETYPE_UNUSED_VALUE_AFTER_RETURN) {
    iVar2 = numRepeats;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar2 = 0xc;
    }
    if (optimized) {
      std::operator+(&local_150,&precision," vec4 func (");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numLoopIterations,&local_150,&precision);
      std::operator+(&local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numLoopIterations," vec4 v)\n{\n\t");
      std::operator+(&bStack_1d8,&local_1b8,&precision);
      std::operator+(&funcDefs,&bStack_1d8,
                     " vec4 used = vec4(0.6, 0.7, 0.8, 0.9) * v;\n\treturn used;\n}\n");
      std::__cxx11::string::~string((string *)&bStack_1d8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&numLoopIterations);
      this_00 = &local_150;
    }
    else {
      std::operator+(&local_b0,&precision," vec4 func (");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numLoopIterations_2,&local_b0,&precision);
      std::operator+(&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numLoopIterations_2," vec4 v)\n{\n\t");
      std::operator+(&local_f0,&local_110,&precision);
      std::operator+(&local_150,&local_f0," vec4 used = vec4(0.6, 0.7, 0.8, 0.9) * v;\n\t");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numLoopIterations,&local_150,&precision);
      std::operator+(&local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numLoopIterations," vec4 unused = cos(exp(sin(v))*log(sqrt(v)));\n");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"\tunused = sin(sin(sin(sin(unused))));\n",&local_191);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,glcts::fixed_sample_locations_values + 1,&local_192);
      repeat(&statements,&local_50,iVar2,&local_70);
      std::operator+(&bStack_1d8,&local_1b8,&statements);
      std::operator+(&funcDefs,&bStack_1d8,
                     "\treturn used;\n\tused = used*unused;\treturn used;\n}\n");
      std::__cxx11::string::~string((string *)&bStack_1d8);
      std::__cxx11::string::~string((string *)&statements);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&numLoopIterations);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&numLoopIterations_2);
      this_00 = &local_b0;
    }
LAB_00f4ba02:
    std::__cxx11::string::~string((string *)this_00);
  }
  else if (this->m_caseType == CASETYPE_DEAD_BRANCH_FUNC_CALL) {
    if (!optimized) {
      std::operator+(&local_1b8,&precision," float func (");
      std::operator+(&bStack_1d8,&local_1b8,&precision);
      std::operator+(&funcDefs,&bStack_1d8," float x) { return 2.0*x; }\n");
      std::__cxx11::string::~string((string *)&bStack_1d8);
      this_00 = &local_1b8;
      goto LAB_00f4ba02;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&funcDefs,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&bStack_1d8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&funcDefs,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&bStack_1d8);
  }
  iVar2 = 4;
  iVar3 = 0x10;
  switch(this->m_caseType) {
  case CASETYPE_DEAD_BRANCH_SIMPLE:
    numLoopIterations = iVar2;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      numLoopIterations = iVar3;
    }
    if (optimized) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&statements,"\tvalue = vec4(0.6, 0.7, 0.8, 0.9) * value;\n",
                 (allocator<char> *)&bStack_1d8);
      goto LAB_00f4c04c;
    }
    de::toString<int>(&local_1b8,&numLoopIterations);
    std::operator+(&bStack_1d8,
                   "\tvalue = vec4(0.6, 0.7, 0.8, 0.9) * value;\n\tif (2 < 1)\n\t{\n\t\tvalue = cos(exp(sin(value))*log(sqrt(value)));\n\t\tfor (int i = 0; i < "
                   ,&local_1b8);
    std::operator+(&statements,&bStack_1d8,"; i++)\n\t\t\tvalue = sin(value);\n\t}\n");
    goto LAB_00f4bd56;
  case CASETYPE_DEAD_BRANCH_COMPLEX:
    useConst = true;
    goto LAB_00f4baf0;
  case CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST:
    useConst = false;
LAB_00f4baf0:
    deadBranchComplexCaseStatements
              (&statements,optimized,&precision,useConst,CVar1 == CASESHADERTYPE_VERTEX);
    goto LAB_00f4c04c;
  case CASETYPE_DEAD_BRANCH_FUNC_CALL:
    numLoopIterations = iVar2;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      numLoopIterations = iVar3;
    }
    if (optimized) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&statements,"\tvalue = vec4(0.6, 0.7, 0.8, 0.9) * value;\n",
                 (allocator<char> *)&bStack_1d8);
      goto LAB_00f4c04c;
    }
    de::toString<int>(&local_1b8,&numLoopIterations);
    std::operator+(&bStack_1d8,
                   "\tvalue = vec4(0.6, 0.7, 0.8, 0.9) * value;\n\tif (func(0.3) > 1.0)\n\t{\n\t\tvalue = cos(exp(sin(value))*log(sqrt(value)));\n\t\tfor (int i = 0; i < "
                   ,&local_1b8);
    std::operator+(&statements,&bStack_1d8,"; i++)\n\t\t\tvalue = sin(value);\n\t}\n");
LAB_00f4bd56:
    std::__cxx11::string::~string((string *)&bStack_1d8);
    pbVar4 = &local_1b8;
    break;
  case CASETYPE_UNUSED_VALUE_BASIC:
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      numRepeats = 0xc;
    }
    if (optimized) {
      std::operator+(&bStack_1d8,"\t",&precision);
      std::operator+(&statements,&bStack_1d8,
                     " vec4 used = vec4(0.6, 0.7, 0.8, 0.9) * value;\n\tvalue = used;\n");
    }
    else {
      std::operator+(&local_f0,"\t",&precision);
      std::operator+(&local_150,&local_f0," vec4 used = vec4(0.6, 0.7, 0.8, 0.9) * value;\n\t");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numLoopIterations,&local_150,&precision);
      std::operator+(&local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numLoopIterations,
                     " vec4 unused = cos(exp(sin(value))*log(sqrt(value))) + used;\n");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&numLoopIterations_2,"\tunused = sin(sin(sin(sin(unused))));\n",
                 (allocator<char> *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_70);
      repeat(&local_110,(string *)&numLoopIterations_2,numRepeats,&local_b0);
      std::operator+(&bStack_1d8,&local_1b8,&local_110);
      std::operator+(&statements,&bStack_1d8,"\tvalue = used;\n");
LAB_00f4bfef:
      std::__cxx11::string::~string((string *)&bStack_1d8);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_b0);
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &numLoopIterations_2;
LAB_00f4c019:
      std::__cxx11::string::~string((string *)pbVar4);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&numLoopIterations);
      std::__cxx11::string::~string((string *)&local_150);
      pbVar4 = &local_f0;
    }
    break;
  case CASETYPE_UNUSED_VALUE_LOOP:
    numLoopIterations_2 = iVar2;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      numLoopIterations_2 = iVar3;
    }
    if (!optimized) {
      std::operator+(&local_f0,"\t",&precision);
      std::operator+(&local_150,&local_f0," vec4 used = vec4(0.6, 0.7, 0.8, 0.9) * value;\n\t");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numLoopIterations,&local_150,&precision);
      std::operator+(&local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numLoopIterations,
                     " vec4 unused = cos(exp(sin(value))*log(sqrt(value)));\n\tfor (int i = 0; i < "
                    );
      de::toString<int>(&local_110,&numLoopIterations_2);
      std::operator+(&bStack_1d8,&local_1b8,&local_110);
      std::operator+(&statements,&bStack_1d8,
                     "; i++)\n\t\tunused = sin(unused + used);\n\tvalue = used;\n");
      std::__cxx11::string::~string((string *)&bStack_1d8);
      pbVar4 = &local_110;
      goto LAB_00f4c019;
    }
    std::operator+(&bStack_1d8,"\t",&precision);
    std::operator+(&statements,&bStack_1d8,
                   " vec4 used = vec4(0.6, 0.7, 0.8, 0.9) * value;\n\tvalue = used;\n");
    pbVar4 = &bStack_1d8;
    break;
  case CASETYPE_UNUSED_VALUE_DEAD_BRANCH:
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      numRepeats = 0xc;
    }
    if (!optimized) {
      std::operator+(&local_f0,"\t",&precision);
      std::operator+(&local_150,&local_f0," vec4 used = vec4(0.6, 0.7, 0.8, 0.9) * value;\n\t");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numLoopIterations,&local_150,&precision);
      std::operator+(&local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numLoopIterations," vec4 unused = cos(exp(sin(value))*log(sqrt(value)));\n");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&numLoopIterations_2,"\tunused = sin(sin(sin(sin(unused))));\n",
                 (allocator<char> *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_70);
      repeat(&local_110,(string *)&numLoopIterations_2,numRepeats,&local_b0);
      std::operator+(&bStack_1d8,&local_1b8,&local_110);
      std::operator+(&statements,&bStack_1d8,
                     "\tif (2 < 1)\n\t\tused = used*unused;\n\tvalue = used;\n");
      goto LAB_00f4bfef;
    }
    std::operator+(&bStack_1d8,"\t",&precision);
    std::operator+(&statements,&bStack_1d8,
                   " vec4 used = vec4(0.6, 0.7, 0.8, 0.9) * value;\n\tvalue = used;\n");
    pbVar4 = &bStack_1d8;
    break;
  case CASETYPE_UNUSED_VALUE_AFTER_RETURN:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&statements,"\tvalue = func(value);\n",(allocator<char> *)&bStack_1d8);
    goto LAB_00f4c04c;
  case CASETYPE_UNUSED_VALUE_MUL_ZERO:
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      numRepeats = 0xc;
    }
    if (!optimized) {
      std::operator+(&local_f0,"\t",&precision);
      std::operator+(&local_150,&local_f0," vec4 used = vec4(0.6, 0.7, 0.8, 0.9) * value;\n\t");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numLoopIterations,&local_150,&precision);
      std::operator+(&local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numLoopIterations," vec4 unused = cos(exp(sin(value))*log(sqrt(value)));\n");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&numLoopIterations_2,"\tunused = sin(sin(sin(sin(unused))));\n",
                 (allocator<char> *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_70);
      repeat(&local_110,(string *)&numLoopIterations_2,numRepeats,&local_b0);
      std::operator+(&bStack_1d8,&local_1b8,&local_110);
      std::operator+(&statements,&bStack_1d8,"\tvalue = used + unused*float(1-1);\n");
      goto LAB_00f4bfef;
    }
    std::operator+(&bStack_1d8,"\t",&precision);
    std::operator+(&statements,&bStack_1d8,
                   " vec4 used = vec4(0.6, 0.7, 0.8, 0.9) * value;\n\tvalue = used;\n");
    pbVar4 = &bStack_1d8;
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&statements,(char *)0x0,(allocator<char> *)&bStack_1d8);
    goto LAB_00f4c04c;
  }
  std::__cxx11::string::~string((string *)pbVar4);
LAB_00f4c04c:
  defaultProgramData(__return_storage_ptr__,(this->super_ShaderOptimizationCase).m_caseShaderType,
                     &funcDefs,&statements);
  std::__cxx11::string::~string((string *)&statements);
  std::__cxx11::string::~string((string *)&funcDefs);
  std::__cxx11::string::~string((string *)&precision);
  return __return_storage_ptr__;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const bool		isVertexCase	= m_caseShaderType == CASESHADERTYPE_VERTEX;
		const string	precision		= getShaderPrecision(m_caseShaderType);
		const string	funcDefs		= m_caseType == CASETYPE_DEAD_BRANCH_FUNC_CALL		? deadBranchFuncCallCaseFuncDefs		(optimized, precision)
										: m_caseType == CASETYPE_UNUSED_VALUE_AFTER_RETURN	? unusedValueAfterReturnCaseFuncDefs	(optimized, precision, isVertexCase)
										: "";

		const string	statements		= m_caseType == CASETYPE_DEAD_BRANCH_SIMPLE				? deadBranchSimpleCaseStatements			(optimized, isVertexCase)
										: m_caseType == CASETYPE_DEAD_BRANCH_COMPLEX			? deadBranchComplexCaseStatements			(optimized, precision, true,	isVertexCase)
										: m_caseType == CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST	? deadBranchComplexCaseStatements			(optimized, precision, false,	isVertexCase)
										: m_caseType == CASETYPE_DEAD_BRANCH_FUNC_CALL			? deadBranchFuncCallCaseStatements			(optimized, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_BASIC				? unusedValueBasicCaseStatements			(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_LOOP				? unusedValueLoopCaseStatements				(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_DEAD_BRANCH		? unusedValueDeadBranchCaseStatements		(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_AFTER_RETURN		? unusedValueAfterReturnCaseStatements		()
										: m_caseType == CASETYPE_UNUSED_VALUE_MUL_ZERO			? unusedValueMulZeroCaseStatements			(optimized, precision, isVertexCase)
										: DE_NULL;

		return defaultProgramData(m_caseShaderType, funcDefs, statements);
	}